

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddGhostJoin(Clipper *this,OutPt *op,IntPoint OffPt)

{
  Join *j;
  
  j = (Join *)operator_new(0x20);
  j->OutPt1 = op;
  j->OutPt2 = (OutPt *)0x0;
  (j->OffPt).X = OffPt.X;
  (j->OffPt).Y = OffPt.Y;
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::push_back
            (&this->m_GhostJoins,&j);
  return;
}

Assistant:

void Clipper::AddGhostJoin(OutPt *op, const IntPoint OffPt)
{
  Join* j = new Join;
  j->OutPt1 = op;
  j->OutPt2 = 0;
  j->OffPt = OffPt;
  m_GhostJoins.push_back(j);
}